

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf_impl.cpp
# Opt level: O1

int32_t utf8_back1SafeBody_63(uint8_t *s,int32_t start,int32_t i)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  byte *pbVar6;
  long lVar7;
  uint uVar8;
  bool bVar9;
  
  lVar7 = (long)i;
  bVar1 = s[lVar7];
  if (i <= start || -0x41 < (char)bVar1) {
    return i;
  }
  iVar5 = (int)(lVar7 + -1);
  bVar2 = s[lVar7 + -1];
  if ((byte)(bVar2 + 0x3e) < 0x33) {
    if (0xdf < bVar2) {
      if (bVar2 < 0xf0) {
        pbVar6 = (byte *)(" 000000000000\x1000" + (bVar2 & 0xf));
        uVar8 = (uint)(bVar1 >> 5);
      }
      else {
        pbVar6 = (byte *)("" + (bVar1 >> 4));
        uVar8 = bVar2 & 7;
      }
      if ((*pbVar6 >> uVar8 & 1) == 0) goto LAB_002d8c83;
    }
LAB_002d8c87:
    bVar3 = false;
  }
  else {
    bVar3 = iVar5 <= start;
    iVar5 = (int)CONCAT71((int7)((ulong)(lVar7 + -1) >> 8),bVar3 || -0x41 < (char)bVar2);
    if (!bVar3 && -0x41 >= (char)bVar2) {
      iVar5 = (int)(lVar7 + -2);
      bVar1 = s[lVar7 + -2];
      if ((byte)(bVar1 + 0x20) < 0x15) {
        pbVar6 = (byte *)(" 000000000000\x1000" + (bVar1 & 0xf));
        if (0xef < bVar1) {
          pbVar6 = (byte *)("" + (bVar2 >> 4));
        }
        bVar4 = bVar1 & 7;
        if (0xef >= bVar1) {
          bVar4 = bVar2 >> 5;
        }
        bVar9 = (*pbVar6 >> bVar4 & 1) == 0;
      }
      else {
        bVar3 = iVar5 <= start;
        bVar9 = true;
        iVar5 = (int)CONCAT71((int7)((ulong)(lVar7 + -2) >> 8),bVar3 || -0x41 < (char)bVar1);
        if (!bVar3 && -0x41 >= (char)bVar1) {
          iVar5 = i + -3;
          if (((byte)(s[lVar7 + -3] + 0x10) < 5) &&
             (((byte)""[bVar1 >> 4] >> (s[lVar7 + -3] & 7) & 1) != 0)) {
            bVar9 = false;
          }
        }
      }
      if (!bVar9) goto LAB_002d8c87;
    }
LAB_002d8c83:
    bVar3 = true;
  }
  if (bVar3) {
    return i;
  }
  return iVar5;
}

Assistant:

U_CAPI int32_t U_EXPORT2
utf8_back1SafeBody(const uint8_t *s, int32_t start, int32_t i) {
    // Same as utf8_prevCharSafeBody(..., strict=-1) minus assembling code points.
    int32_t orig_i=i;
    uint8_t c=s[i];
    if(U8_IS_TRAIL(c) && i>start) {
        uint8_t b1=s[--i];
        if(U8_IS_LEAD(b1)) {
            if(b1<0xe0 ||
                    (b1<0xf0 ? U8_IS_VALID_LEAD3_AND_T1(b1, c) : U8_IS_VALID_LEAD4_AND_T1(b1, c))) {
                return i;
            }
        } else if(U8_IS_TRAIL(b1) && i>start) {
            uint8_t b2=s[--i];
            if(0xe0<=b2 && b2<=0xf4) {
                if(b2<0xf0 ? U8_IS_VALID_LEAD3_AND_T1(b2, b1) : U8_IS_VALID_LEAD4_AND_T1(b2, b1)) {
                    return i;
                }
            } else if(U8_IS_TRAIL(b2) && i>start) {
                uint8_t b3=s[--i];
                if(0xf0<=b3 && b3<=0xf4 && U8_IS_VALID_LEAD4_AND_T1(b3, b2)) {
                    return i;
                }
            }
        }
    }
    return orig_i;
}